

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::detail::enum_base::value(enum_base *this,char *name_,object *value,char *doc)

{
  bool bVar1;
  value_error *this_00;
  allocator local_e1;
  str name;
  dict entries;
  string type_name;
  undefined1 local_b0 [24];
  object local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  type_name._M_string_length = (size_type)(this->m_base).m_ptr;
  type_name.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_1b4e23;
  type_name.field_2._8_8_ = 0;
  dict::dict<pybind11::detail::accessor_policies::str_attr>
            (&entries,(accessor<pybind11::detail::accessor_policies::str_attr> *)&type_name);
  object::~object((object *)((long)&type_name.field_2 + 8));
  str::str(&name,name_);
  bVar1 = dict::contains<pybind11::str&>(&entries,&name);
  if (!bVar1) {
    local_b0._0_8_ = (value->super_handle).m_ptr;
    if ((PyObject *)local_b0._0_8_ != (PyObject *)0x0) {
      ((PyObject *)local_b0._0_8_)->ob_refcnt = ((PyObject *)local_b0._0_8_)->ob_refcnt + 1;
    }
    local_b0._8_8_ = doc;
    object_api<pybind11::handle>::operator[]
              ((item_accessor *)&type_name,(object_api<pybind11::handle> *)&entries,
               (handle)name.super_object.super_handle.m_ptr);
    accessor<pybind11::detail::accessor_policies::generic_item>::operator=
              ((accessor<pybind11::detail::accessor_policies::generic_item> *)&type_name,
               (pair<pybind11::object,_const_char_*> *)local_b0);
    accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
              ((accessor<pybind11::detail::accessor_policies::generic_item> *)&type_name);
    object::~object((object *)local_b0);
    object_api<pybind11::handle>::attr
              ((obj_attr_accessor *)&type_name,(object_api<pybind11::handle> *)this,
               (handle)name.super_object.super_handle.m_ptr);
    accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)&type_name,value);
    accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::obj_attr> *)&type_name);
    object::~object(&name.super_object);
    object::~object(&entries.super_object);
    return;
  }
  local_b0._8_8_ = (this->m_base).m_ptr;
  local_b0._16_8_ = "__name__";
  local_98.super_handle.m_ptr = (handle)(PyObject *)0x0;
  str::str<pybind11::detail::accessor_policies::str_attr>
            ((str *)&local_90,(accessor<pybind11::detail::accessor_policies::str_attr> *)local_b0);
  str::operator_cast_to_string(&type_name,(str *)&local_90);
  object::~object((object *)&local_90);
  object::~object(&local_98);
  this_00 = (value_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_50,&type_name,": element \"");
  std::__cxx11::string::string((string *)&local_70,name_,&local_e1);
  std::operator+(&local_90,&local_50,&local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 &local_90,"\" already exists!");
  value_error::runtime_error(this_00,(string *)local_b0);
  __cxa_throw(this_00,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PYBIND11_NOINLINE void value(char const* name_, object value, const char *doc = nullptr) {
        dict entries = m_base.attr("__entries");
        str name(name_);
        if (entries.contains(name)) {
            std::string type_name = (std::string) str(m_base.attr("__name__"));
            throw value_error(type_name + ": element \"" + std::string(name_) + "\" already exists!");
        }

        entries[name] = std::make_pair(value, doc);
        m_base.attr(name) = value;
    }